

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

object * get_random_monster_object(monster_conflict *mon)

{
  object *poVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint32_t m;
  object *poVar4;
  object **ppoVar5;
  
  ppoVar5 = &mon->held_obj;
  m = 1;
  poVar4 = (object *)0x0;
  do {
    poVar1 = *ppoVar5;
    if (poVar1 == (object *)0x0) {
      return poVar4;
    }
    if (poVar1->artifact == (artifact *)0x0) {
LAB_0018028f:
      uVar3 = Rand_div(m);
      if (uVar3 == 0) {
        poVar4 = poVar1;
      }
      m = m + 1;
    }
    else {
      _Var2 = quest_unique_monster_check(mon->race);
      if (!_Var2) goto LAB_0018028f;
    }
    ppoVar5 = &poVar1->next;
  } while( true );
}

Assistant:

struct object *get_random_monster_object(struct monster *mon)
{
    struct object *obj, *pick = NULL;
    int i = 1;

    /* Pick a random object */
    for (obj = mon->held_obj; obj; obj = obj->next) {
        /* Check it isn't a quest artifact */
        if (obj->artifact && quest_unique_monster_check(mon->race))
            continue;

        if (one_in_(i)) pick = obj;
        i++;
    }

    return pick;
}